

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O2

void __thiscall VmaJsonWriter::ContinueString(VmaJsonWriter *this,uint32_t n)

{
  VmaStringBuilder::AddNumber(this->m_SB,n);
  return;
}

Assistant:

void VmaJsonWriter::ContinueString(uint32_t n)
{
    VMA_ASSERT(m_InsideString);
    m_SB.AddNumber(n);
}